

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

double Js::Math::HypotHelper(Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  double *pdVar5;
  uint idxArg;
  double value;
  double dVar6;
  double local_68;
  double local_40;
  double local_38;
  
  local_38 = 0.0;
  local_40 = 0.0;
  if (((ulong)args->Info & 0xfffffe) != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_68 = NAN;
    idxArg = 1;
    bVar2 = false;
    local_38 = 0.0;
    local_40 = 0.0;
    do {
      aValue = Arguments::operator[](args,idxArg);
      if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00d34d61;
        if ((ulong)aValue >> 0x32 == 0) {
          value = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
        }
        else {
          value = (double)((ulong)aValue ^ 0xfffc000000000000);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
LAB_00d34d61:
        value = (double)(int)aValue;
      }
      bVar3 = NumberUtilities::IsSpecial(value,0x7ff0000000000000);
      if ((bVar3) || (bVar3 = NumberUtilities::IsSpecial(value,0xfff0000000000000), bVar3)) {
        pdVar5 = &NumberConstants::POSITIVE_INFINITY;
        goto LAB_00d34ea4;
      }
      if (!bVar2) {
        bVar3 = NumberUtilities::IsNan(value);
        if (bVar3) {
          bVar2 = true;
        }
        else {
          bVar3 = NumberUtilities::IsNan(value);
          dVar6 = local_68;
          if (!bVar3) {
            dVar6 = ABS(value);
          }
          if (dVar6 <= local_40) {
            if ((local_40 != 0.0) || (NAN(local_40))) {
              local_38 = local_38 + (dVar6 / local_40) * (dVar6 / local_40);
            }
          }
          else {
            local_38 = local_38 * (local_40 / dVar6) * (local_40 / dVar6) + 1.0;
            local_40 = dVar6;
          }
        }
      }
      idxArg = idxArg + 1;
    } while (idxArg < (*(uint *)&args->Info & 0xffffff));
    if (bVar2) {
      pdVar5 = &NumberConstants::NaN;
LAB_00d34ea4:
      return *pdVar5;
    }
  }
  if (local_38 < 0.0) {
    local_38 = sqrt(local_38);
  }
  else {
    local_38 = SQRT(local_38);
  }
  return local_40 * local_38;
}

Assistant:

double Math::HypotHelper(Arguments args, ScriptContext *scriptContext)
    {
        // CRT does not have a multiple version of hypot, so we implement it here ourselves.
        bool foundNaN = false;
        double scale = 0;
        double sum = 0;

        //Ignore first argument which is this pointer
        for (uint counter = 1; counter < args.Info.Count; counter++)
        {
            double doubleVal = JavascriptConversion::ToNumber(args[counter], scriptContext);

            if (JavascriptNumber::IsPosInf(doubleVal) || JavascriptNumber::IsNegInf(doubleVal))
            {
                return JavascriptNumber::POSITIVE_INFINITY;
            }

            if (!foundNaN)
            {
                if (JavascriptNumber::IsNan(doubleVal))
                {
                    //Even though we found NaN, we still need to validate none of the other arguments are +Infinity or -Infinity
                    foundNaN = true;
                }
                else
                {
                    doubleVal = Math::Abs(doubleVal);
                    if (scale < doubleVal)
                    {
                        sum = sum * (scale / doubleVal) * (scale / doubleVal) + 1; /* scale/scale === 1*/
                        //change the scale to new max value
                        scale = doubleVal;
                    }
                    else if (scale != 0)
                    {
                        sum += (doubleVal / scale) * (doubleVal / scale);
                    }
                }
            }
        }

        if (foundNaN)
        {
            return JavascriptNumber::NaN;
        }

        return scale * ::sqrt(sum);
    }